

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast-lstm.cc
# Opt level: O2

int __thiscall
dynet::FastLSTMBuilder::copy(FastLSTMBuilder *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  long lVar1;
  pointer pvVar2;
  ulong uVar3;
  ostream *poVar4;
  invalid_argument *this_00;
  pointer pvVar5;
  size_t j;
  ulong uVar6;
  string asStack_1b8 [32];
  ostringstream oss;
  
  pvVar5 = (this->params).
           super__Vector_base<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar2 = (this->params).
           super__Vector_base<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((long)pvVar2 - (long)pvVar5 == *(long *)(dst + 0xd8) - *(long *)(dst + 0xd0)) {
    for (uVar6 = 0; uVar3 = ((long)pvVar2 - (long)pvVar5) / 0x18, uVar6 < uVar3; uVar6 = uVar6 + 1)
    {
      for (uVar3 = 0;
          lVar1 = *(long *)&pvVar5[uVar6].
                            super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>.
                            _M_impl.super__Vector_impl_data,
          uVar3 < (ulong)((long)*(pointer *)
                                 ((long)&pvVar5[uVar6].
                                         super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>
                                         ._M_impl.super__Vector_impl_data + 8) - lVar1 >> 3);
          uVar3 = uVar3 + 1) {
        *(undefined8 *)(lVar1 + uVar3 * 8) =
             *(undefined8 *)(*(long *)(*(long *)(dst + 0xd0) + uVar6 * 0x18) + uVar3 * 8);
        pvVar5 = (this->params).
                 super__Vector_base<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      pvVar2 = (this->params).
               super__Vector_base<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    return (int)uVar3;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar4 = std::operator<<((ostream *)&oss,
                           "Attempt to copy FastLSTMBuilder with different number of parameters (");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<(poVar4," != ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::operator<<(poVar4,")");
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::invalid_argument::invalid_argument(this_00,asStack_1b8);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void FastLSTMBuilder::copy(const RNNBuilder & rnn) {
  const FastLSTMBuilder & rnn_lstm = (const FastLSTMBuilder&)rnn;
  DYNET_ARG_CHECK(params.size() == rnn_lstm.params.size(),
                          "Attempt to copy FastLSTMBuilder with different number of parameters "
                          "(" << params.size() << " != " << rnn_lstm.params.size() << ")");
  for(size_t i = 0; i < params.size(); ++i)
      for(size_t j = 0; j < params[i].size(); ++j)
        params[i][j] = rnn_lstm.params[i][j];
}